

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O3

Vec_Str_t * Abc_SclProduceGenlibStr(SC_Lib *p,float Slew,float Gain,int nGatesMin,int *pnCellCount)

{
  char cVar1;
  uint uVar2;
  void *pvVar3;
  SC_Cell *pRepr;
  undefined8 *puVar4;
  size_t sVar5;
  SC_Lib *__size;
  long lVar6;
  Vec_Str_t *pVVar7;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  int Count;
  int iVar11;
  SC_Cell *pSVar12;
  int i_4;
  long lVar13;
  long lVar14;
  SC_Lib *p_00;
  int iVar15;
  SC_Cell *pCell;
  void *pvVar16;
  int i_1;
  ulong uVar17;
  int i;
  int i_2;
  int iVar18;
  SC_Lib *pSVar19;
  float fVar20;
  char Buffer [200];
  int local_130;
  SC_Lib local_f8;
  
  lVar6 = (long)(p->vCellClasses).nSize;
  iVar18 = 0;
  iVar11 = 0;
  if (0 < lVar6) {
    lVar14 = 0;
    iVar11 = 0;
    do {
      pvVar3 = (p->vCellClasses).pArray[lVar14];
      if (*(int *)((long)pvVar3 + 0x44) == 1) {
        iVar15 = 0;
        pvVar16 = pvVar3;
        do {
          iVar15 = iVar15 + (uint)(*(int *)((long)pvVar16 + 0xc) == 0);
          pvVar16 = *(void **)((long)pvVar16 + 0x48);
        } while (pvVar16 != pvVar3);
        if (iVar11 <= iVar15) {
          iVar11 = iVar15;
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != lVar6);
  }
  iVar15 = 0;
  if (nGatesMin < iVar11) {
    iVar15 = nGatesMin;
  }
  Abc_SclMarkSkippedCells(p);
  pVVar7 = (Vec_Str_t *)malloc(0x10);
  pVVar7->nCap = 1000;
  pVVar7->nSize = 0;
  pcVar8 = (char *)malloc(1000);
  pVVar7->pArray = pcVar8;
  lVar6 = 0;
  while( true ) {
    cVar1 = "GATE _const0_            0.00 z=CONST0;\n"[lVar6];
    if (iVar18 == pVVar7->nCap) {
      if (iVar18 < 0x10) {
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(0x10);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
        }
        pVVar7->pArray = pcVar8;
        pVVar7->nCap = 0x10;
      }
      else {
        uVar2 = iVar18 * 2;
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc((ulong)uVar2);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,(ulong)uVar2);
        }
        pVVar7->pArray = pcVar8;
        pVVar7->nCap = uVar2;
      }
    }
    else {
      pcVar8 = pVVar7->pArray;
    }
    iVar18 = pVVar7->nSize;
    pVVar7->nSize = iVar18 + 1;
    pcVar8[iVar18] = cVar1;
    if (lVar6 == 0x27) break;
    iVar18 = pVVar7->nSize;
    lVar6 = lVar6 + 1;
  }
  lVar6 = 0;
  do {
    cVar1 = "GATE _const1_            0.00 z=CONST1;\n"[lVar6];
    uVar2 = pVVar7->nSize;
    if (uVar2 == pVVar7->nCap) {
      if ((int)uVar2 < 0x10) {
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(0x10);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
        }
        pVVar7->pArray = pcVar8;
        pVVar7->nCap = 0x10;
      }
      else {
        sVar9 = (ulong)uVar2 * 2;
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(sVar9);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,sVar9);
        }
        pVVar7->pArray = pcVar8;
        pVVar7->nCap = (int)sVar9;
      }
    }
    else {
      pcVar8 = pVVar7->pArray;
    }
    iVar18 = pVVar7->nSize;
    pVVar7->nSize = iVar18 + 1;
    pcVar8[iVar18] = cVar1;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x28);
  if (nGatesMin == 0) {
    iVar15 = nGatesMin;
  }
  iVar18 = (p->vCellClasses).nSize;
  if (iVar18 < 1) {
    local_130 = 2;
  }
  else {
    local_130 = 2;
    lVar6 = 0;
    do {
      pRepr = (SC_Cell *)(p->vCellClasses).pArray[lVar6];
      if ((pRepr->n_inputs != 0) && (pRepr->n_outputs < 2)) {
        if ((iVar15 != 0) && (2 < pRepr->n_inputs)) {
          iVar11 = 0;
          pSVar12 = pRepr;
          do {
            iVar11 = iVar11 + (uint)(pSVar12->fSkip == 0);
            pSVar12 = pSVar12->pNext;
          } while (pSVar12 != pRepr);
          if (iVar11 < iVar15) goto LAB_003f31c6;
        }
        sVar9 = strlen(pRepr->pName);
        if (199 < sVar9) {
          __assert_fail("strlen(pRepr->pName) < 200",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLibUtil.c"
                        ,0x37f,
                        "Vec_Str_t *Abc_SclProduceGenlibStr(SC_Lib *, float, float, int, int *)");
        }
        lVar14 = 0;
        do {
          cVar1 = "GATE "[lVar14];
          uVar2 = pVVar7->nSize;
          if (uVar2 == pVVar7->nCap) {
            if ((int)uVar2 < 0x10) {
              if (pVVar7->pArray == (char *)0x0) {
                pcVar8 = (char *)malloc(0x10);
              }
              else {
                pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
              }
              pVVar7->pArray = pcVar8;
              pVVar7->nCap = 0x10;
            }
            else {
              sVar9 = (ulong)uVar2 * 2;
              if (pVVar7->pArray == (char *)0x0) {
                pcVar8 = (char *)malloc(sVar9);
              }
              else {
                pcVar8 = (char *)realloc(pVVar7->pArray,sVar9);
              }
              pVVar7->pArray = pcVar8;
              pVVar7->nCap = (int)sVar9;
            }
          }
          else {
            pcVar8 = pVVar7->pArray;
          }
          iVar18 = pVVar7->nSize;
          pVVar7->nSize = iVar18 + 1;
          pcVar8[iVar18] = cVar1;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 5);
        sprintf((char *)&local_f8,"%-16s",pRepr->pName);
        sVar9 = strlen((char *)&local_f8);
        if (0 < (int)(uint)sVar9) {
          uVar17 = 0;
          do {
            cVar1 = *(char *)((long)&local_f8.pName + uVar17);
            uVar2 = pVVar7->nSize;
            if (uVar2 == pVVar7->nCap) {
              if ((int)uVar2 < 0x10) {
                if (pVVar7->pArray == (char *)0x0) {
                  pcVar8 = (char *)malloc(0x10);
                }
                else {
                  pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
                }
                pVVar7->pArray = pcVar8;
                pVVar7->nCap = 0x10;
              }
              else {
                sVar5 = (ulong)uVar2 * 2;
                if (pVVar7->pArray == (char *)0x0) {
                  pcVar8 = (char *)malloc(sVar5);
                }
                else {
                  pcVar8 = (char *)realloc(pVVar7->pArray,sVar5);
                }
                pVVar7->pArray = pcVar8;
                pVVar7->nCap = (int)sVar5;
              }
            }
            else {
              pcVar8 = pVVar7->pArray;
            }
            iVar18 = pVVar7->nSize;
            pVVar7->nSize = iVar18 + 1;
            pcVar8[iVar18] = cVar1;
            uVar17 = uVar17 + 1;
          } while (((uint)sVar9 & 0x7fffffff) != uVar17);
        }
        uVar2 = pVVar7->nSize;
        if (uVar2 == pVVar7->nCap) {
          if ((int)uVar2 < 0x10) {
            if (pVVar7->pArray == (char *)0x0) {
              pcVar8 = (char *)malloc(0x10);
            }
            else {
              pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
            }
            pVVar7->pArray = pcVar8;
            pVVar7->nCap = 0x10;
          }
          else {
            sVar9 = (ulong)uVar2 * 2;
            if (pVVar7->pArray == (char *)0x0) {
              pcVar8 = (char *)malloc(sVar9);
            }
            else {
              pcVar8 = (char *)realloc(pVVar7->pArray,sVar9);
            }
            pVVar7->pArray = pcVar8;
            pVVar7->nCap = (int)sVar9;
          }
        }
        else {
          pcVar8 = pVVar7->pArray;
        }
        iVar18 = pVVar7->nSize;
        pVVar7->nSize = iVar18 + 1;
        pcVar8[iVar18] = ' ';
        sprintf((char *)&local_f8,"%7.2f",(double)pRepr->area);
        sVar9 = strlen((char *)&local_f8);
        if (0 < (int)(uint)sVar9) {
          uVar17 = 0;
          do {
            cVar1 = *(char *)((long)&local_f8.pName + uVar17);
            uVar2 = pVVar7->nSize;
            if (uVar2 == pVVar7->nCap) {
              if ((int)uVar2 < 0x10) {
                if (pVVar7->pArray == (char *)0x0) {
                  pcVar8 = (char *)malloc(0x10);
                }
                else {
                  pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
                }
                pVVar7->pArray = pcVar8;
                pVVar7->nCap = 0x10;
              }
              else {
                sVar5 = (ulong)uVar2 * 2;
                if (pVVar7->pArray == (char *)0x0) {
                  pcVar8 = (char *)malloc(sVar5);
                }
                else {
                  pcVar8 = (char *)realloc(pVVar7->pArray,sVar5);
                }
                pVVar7->pArray = pcVar8;
                pVVar7->nCap = (int)sVar5;
              }
            }
            else {
              pcVar8 = pVVar7->pArray;
            }
            iVar18 = pVVar7->nSize;
            pVVar7->nSize = iVar18 + 1;
            pcVar8[iVar18] = cVar1;
            uVar17 = uVar17 + 1;
          } while (((uint)sVar9 & 0x7fffffff) != uVar17);
        }
        uVar2 = pVVar7->nSize;
        if (uVar2 == pVVar7->nCap) {
          if ((int)uVar2 < 0x10) {
            if (pVVar7->pArray == (char *)0x0) {
              pcVar8 = (char *)malloc(0x10);
            }
            else {
              pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
            }
            pVVar7->pArray = pcVar8;
            pVVar7->nCap = 0x10;
          }
          else {
            sVar9 = (ulong)uVar2 * 2;
            if (pVVar7->pArray == (char *)0x0) {
              pcVar8 = (char *)malloc(sVar9);
            }
            else {
              pcVar8 = (char *)realloc(pVVar7->pArray,sVar9);
            }
            pVVar7->pArray = pcVar8;
            pVVar7->nCap = (int)sVar9;
          }
        }
        else {
          pcVar8 = pVVar7->pArray;
        }
        iVar18 = pVVar7->nSize;
        pVVar7->nSize = iVar18 + 1;
        pcVar8[iVar18] = ' ';
        iVar18 = pRepr->n_inputs;
        if (((long)iVar18 < 0) || ((pRepr->vPins).nSize <= iVar18)) {
LAB_003f330c:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pcVar8 = *(pRepr->vPins).pArray[iVar18];
        sVar9 = strlen(pcVar8);
        if (0 < (int)(uint)sVar9) {
          uVar17 = 0;
          do {
            cVar1 = pcVar8[uVar17];
            uVar2 = pVVar7->nSize;
            if (uVar2 == pVVar7->nCap) {
              if ((int)uVar2 < 0x10) {
                if (pVVar7->pArray == (char *)0x0) {
                  pcVar10 = (char *)malloc(0x10);
                }
                else {
                  pcVar10 = (char *)realloc(pVVar7->pArray,0x10);
                }
                pVVar7->pArray = pcVar10;
                pVVar7->nCap = 0x10;
              }
              else {
                sVar5 = (ulong)uVar2 * 2;
                if (pVVar7->pArray == (char *)0x0) {
                  pcVar10 = (char *)malloc(sVar5);
                }
                else {
                  pcVar10 = (char *)realloc(pVVar7->pArray,sVar5);
                }
                pVVar7->pArray = pcVar10;
                pVVar7->nCap = (int)sVar5;
              }
            }
            else {
              pcVar10 = pVVar7->pArray;
            }
            iVar18 = pVVar7->nSize;
            pVVar7->nSize = iVar18 + 1;
            pcVar10[iVar18] = cVar1;
            uVar17 = uVar17 + 1;
          } while (((uint)sVar9 & 0x7fffffff) != uVar17);
        }
        uVar2 = pVVar7->nSize;
        if (uVar2 == pVVar7->nCap) {
          if ((int)uVar2 < 0x10) {
            if (pVVar7->pArray == (char *)0x0) {
              pcVar8 = (char *)malloc(0x10);
            }
            else {
              pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
            }
            pVVar7->pArray = pcVar8;
            pVVar7->nCap = 0x10;
          }
          else {
            sVar9 = (ulong)uVar2 * 2;
            if (pVVar7->pArray == (char *)0x0) {
              pcVar8 = (char *)malloc(sVar9);
            }
            else {
              pcVar8 = (char *)realloc(pVVar7->pArray,sVar9);
            }
            pVVar7->pArray = pcVar8;
            pVVar7->nCap = (int)sVar9;
          }
        }
        else {
          pcVar8 = pVVar7->pArray;
        }
        iVar18 = pVVar7->nSize;
        pVVar7->nSize = iVar18 + 1;
        pcVar8[iVar18] = '=';
        iVar18 = pRepr->n_inputs;
        if (((long)iVar18 < 0) || ((pRepr->vPins).nSize <= iVar18)) goto LAB_003f330c;
        pSVar19 = *(SC_Lib **)((long)(pRepr->vPins).pArray[iVar18] + 0x28);
        if (pSVar19 == (SC_Lib *)0x0) {
          pSVar19 = (SC_Lib *)0x90aea0;
        }
        p_00 = pSVar19;
        sVar9 = strlen((char *)pSVar19);
        if (0 < (int)(uint)sVar9) {
          uVar17 = 0;
          do {
            cVar1 = *(char *)((long)&pSVar19->pName + uVar17);
            uVar2 = pVVar7->nSize;
            if (uVar2 == pVVar7->nCap) {
              if ((int)uVar2 < 0x10) {
                p_00 = (SC_Lib *)pVVar7->pArray;
                if (p_00 == (SC_Lib *)0x0) {
                  p_00 = (SC_Lib *)&DAT_00000010;
                  pcVar8 = (char *)malloc(0x10);
                }
                else {
                  pcVar8 = (char *)realloc(p_00,0x10);
                }
                pVVar7->pArray = pcVar8;
                pVVar7->nCap = 0x10;
              }
              else {
                __size = (SC_Lib *)((ulong)uVar2 * 2);
                p_00 = (SC_Lib *)pVVar7->pArray;
                if (p_00 == (SC_Lib *)0x0) {
                  p_00 = __size;
                  pcVar8 = (char *)malloc((size_t)__size);
                }
                else {
                  pcVar8 = (char *)realloc(p_00,(size_t)__size);
                }
                pVVar7->pArray = pcVar8;
                pVVar7->nCap = (int)__size;
              }
            }
            else {
              pcVar8 = pVVar7->pArray;
            }
            iVar18 = pVVar7->nSize;
            pVVar7->nSize = iVar18 + 1;
            pcVar8[iVar18] = cVar1;
            uVar17 = uVar17 + 1;
          } while (((uint)sVar9 & 0x7fffffff) != uVar17);
        }
        lVar14 = 0;
        do {
          cVar1 = " ) ;\n"[lVar14 + 3];
          uVar2 = pVVar7->nSize;
          if (uVar2 == pVVar7->nCap) {
            if ((int)uVar2 < 0x10) {
              p_00 = (SC_Lib *)pVVar7->pArray;
              if (p_00 == (SC_Lib *)0x0) {
                p_00 = (SC_Lib *)&DAT_00000010;
                pcVar8 = (char *)malloc(0x10);
              }
              else {
                pcVar8 = (char *)realloc(p_00,0x10);
              }
              pVVar7->pArray = pcVar8;
              pVVar7->nCap = 0x10;
            }
            else {
              pSVar19 = (SC_Lib *)((ulong)uVar2 * 2);
              p_00 = (SC_Lib *)pVVar7->pArray;
              if (p_00 == (SC_Lib *)0x0) {
                p_00 = pSVar19;
                pcVar8 = (char *)malloc((size_t)pSVar19);
              }
              else {
                pcVar8 = (char *)realloc(p_00,(size_t)pSVar19);
              }
              pVVar7->pArray = pcVar8;
              pVVar7->nCap = (int)pSVar19;
            }
          }
          else {
            pcVar8 = pVVar7->pArray;
          }
          iVar18 = pVVar7->nSize;
          pVVar7->nSize = iVar18 + 1;
          pcVar8[iVar18] = cVar1;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 2);
        if (0 < pRepr->n_inputs) {
          lVar14 = 0;
          do {
            if ((pRepr->vPins).nSize <= lVar14) goto LAB_003f330c;
            puVar4 = (undefined8 *)(pRepr->vPins).pArray[lVar14];
            fVar20 = Abc_SclComputeDelayClassPin(p_00,pRepr,(int)lVar14,Slew,Gain);
            if (fVar20 <= 0.0) {
              __assert_fail("Delay > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLibUtil.c"
                            ,0x38f,
                            "Vec_Str_t *Abc_SclProduceGenlibStr(SC_Lib *, float, float, int, int *)"
                           );
            }
            lVar13 = 0;
            do {
              cVar1 = "         PIN "[lVar13];
              uVar2 = pVVar7->nSize;
              if (uVar2 == pVVar7->nCap) {
                if ((int)uVar2 < 0x10) {
                  if (pVVar7->pArray == (char *)0x0) {
                    pcVar8 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
                  }
                  pVVar7->pArray = pcVar8;
                  pVVar7->nCap = 0x10;
                }
                else {
                  sVar9 = (ulong)uVar2 * 2;
                  if (pVVar7->pArray == (char *)0x0) {
                    pcVar8 = (char *)malloc(sVar9);
                  }
                  else {
                    pcVar8 = (char *)realloc(pVVar7->pArray,sVar9);
                  }
                  pVVar7->pArray = pcVar8;
                  pVVar7->nCap = (int)sVar9;
                }
              }
              else {
                pcVar8 = pVVar7->pArray;
              }
              iVar18 = pVVar7->nSize;
              pVVar7->nSize = iVar18 + 1;
              pcVar8[iVar18] = cVar1;
              lVar13 = lVar13 + 1;
            } while (lVar13 != 0xd);
            sprintf((char *)&local_f8,"%-4s",*puVar4);
            sVar9 = strlen((char *)&local_f8);
            if (0 < (int)(uint)sVar9) {
              uVar17 = 0;
              do {
                cVar1 = *(char *)((long)&local_f8.pName + uVar17);
                uVar2 = pVVar7->nSize;
                if (uVar2 == pVVar7->nCap) {
                  if ((int)uVar2 < 0x10) {
                    if (pVVar7->pArray == (char *)0x0) {
                      pcVar8 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
                    }
                    pVVar7->pArray = pcVar8;
                    pVVar7->nCap = 0x10;
                  }
                  else {
                    sVar5 = (ulong)uVar2 * 2;
                    if (pVVar7->pArray == (char *)0x0) {
                      pcVar8 = (char *)malloc(sVar5);
                    }
                    else {
                      pcVar8 = (char *)realloc(pVVar7->pArray,sVar5);
                    }
                    pVVar7->pArray = pcVar8;
                    pVVar7->nCap = (int)sVar5;
                  }
                }
                else {
                  pcVar8 = pVVar7->pArray;
                }
                iVar18 = pVVar7->nSize;
                pVVar7->nSize = iVar18 + 1;
                pcVar8[iVar18] = cVar1;
                uVar17 = uVar17 + 1;
              } while (((uint)sVar9 & 0x7fffffff) != uVar17);
            }
            p_00 = &local_f8;
            sprintf((char *)p_00," UNKNOWN  1  999  %7.2f  0.00  %7.2f  0.00\n",(double)fVar20,
                    SUB84((double)fVar20,0));
            sVar9 = strlen((char *)p_00);
            if (0 < (int)(uint)sVar9) {
              uVar17 = 0;
              do {
                cVar1 = *(char *)((long)&local_f8.pName + uVar17);
                uVar2 = pVVar7->nSize;
                if (uVar2 == pVVar7->nCap) {
                  if ((int)uVar2 < 0x10) {
                    p_00 = (SC_Lib *)pVVar7->pArray;
                    if (p_00 == (SC_Lib *)0x0) {
                      p_00 = (SC_Lib *)&DAT_00000010;
                      pcVar8 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar8 = (char *)realloc(p_00,0x10);
                    }
                    pVVar7->pArray = pcVar8;
                    pVVar7->nCap = 0x10;
                  }
                  else {
                    pSVar19 = (SC_Lib *)((ulong)uVar2 * 2);
                    p_00 = (SC_Lib *)pVVar7->pArray;
                    if (p_00 == (SC_Lib *)0x0) {
                      p_00 = pSVar19;
                      pcVar8 = (char *)malloc((size_t)pSVar19);
                    }
                    else {
                      pcVar8 = (char *)realloc(p_00,(size_t)pSVar19);
                    }
                    pVVar7->pArray = pcVar8;
                    pVVar7->nCap = (int)pSVar19;
                  }
                }
                else {
                  pcVar8 = pVVar7->pArray;
                }
                iVar18 = pVVar7->nSize;
                pVVar7->nSize = iVar18 + 1;
                pcVar8[iVar18] = cVar1;
                uVar17 = uVar17 + 1;
              } while (((uint)sVar9 & 0x7fffffff) != uVar17);
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 < pRepr->n_inputs);
        }
        local_130 = local_130 + 1;
        iVar18 = (p->vCellClasses).nSize;
      }
LAB_003f31c6:
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar18);
  }
  lVar6 = 0;
  do {
    cVar1 = "\n.end\n"[lVar6];
    uVar2 = pVVar7->nSize;
    if (uVar2 == pVVar7->nCap) {
      if ((int)uVar2 < 0x10) {
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(0x10);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
        }
        pVVar7->pArray = pcVar8;
        pVVar7->nCap = 0x10;
      }
      else {
        sVar9 = (ulong)uVar2 * 2;
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(sVar9);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,sVar9);
        }
        pVVar7->pArray = pcVar8;
        pVVar7->nCap = (int)sVar9;
      }
    }
    else {
      pcVar8 = pVVar7->pArray;
    }
    iVar18 = pVVar7->nSize;
    pVVar7->nSize = iVar18 + 1;
    pcVar8[iVar18] = cVar1;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 6);
  uVar2 = pVVar7->nSize;
  if (uVar2 == pVVar7->nCap) {
    if ((int)uVar2 < 0x10) {
      if (pVVar7->pArray == (char *)0x0) {
        pcVar8 = (char *)malloc(0x10);
      }
      else {
        pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
      }
      pVVar7->pArray = pcVar8;
      pVVar7->nCap = 0x10;
    }
    else {
      sVar9 = (ulong)uVar2 * 2;
      if (pVVar7->pArray == (char *)0x0) {
        pcVar8 = (char *)malloc(sVar9);
      }
      else {
        pcVar8 = (char *)realloc(pVVar7->pArray,sVar9);
      }
      pVVar7->pArray = pcVar8;
      pVVar7->nCap = (int)sVar9;
    }
  }
  else {
    pcVar8 = pVVar7->pArray;
  }
  iVar18 = pVVar7->nSize;
  pVVar7->nSize = iVar18 + 1;
  pcVar8[iVar18] = '\0';
  if (pnCellCount != (int *)0x0) {
    *pnCellCount = local_130;
  }
  return pVVar7;
}

Assistant:

Vec_Str_t * Abc_SclProduceGenlibStr( SC_Lib * p, float Slew, float Gain, int nGatesMin, int * pnCellCount )
{
    char Buffer[200];
    Vec_Str_t * vStr;
    SC_Cell * pRepr;
    SC_Pin * pPin;
    int i, k, Count = 2, nClassMax = 0;
    // find the largest number of cells in a class
    SC_LibForEachCellClass( p, pRepr, i )
        if ( pRepr->n_outputs == 1 )
            nClassMax = Abc_MaxInt( nClassMax, Abc_SclClassCellNum(pRepr) );
    // update the number
    if ( nGatesMin && nGatesMin >= nClassMax )
        nGatesMin = 0;
    // mark skipped cells
    Abc_SclMarkSkippedCells( p );
    vStr = Vec_StrAlloc( 1000 );
    Vec_StrPrintStr( vStr, "GATE _const0_            0.00 z=CONST0;\n" );
    Vec_StrPrintStr( vStr, "GATE _const1_            0.00 z=CONST1;\n" );
    SC_LibForEachCellClass( p, pRepr, i )
    {
        if ( pRepr->n_inputs == 0 )
            continue;
        if ( pRepr->n_outputs > 1 )
            continue;
        if ( nGatesMin && pRepr->n_inputs > 2 && Abc_SclClassCellNum(pRepr) < nGatesMin )
            continue;
        assert( strlen(pRepr->pName) < 200 );
        Vec_StrPrintStr( vStr, "GATE " );
        sprintf( Buffer, "%-16s", pRepr->pName );
        Vec_StrPrintStr( vStr, Buffer );
        Vec_StrPrintStr( vStr, " " );
//        sprintf( Buffer, "%7.2f", Abc_SclComputeAreaClass(pRepr) );
        sprintf( Buffer, "%7.2f", pRepr->area );
        Vec_StrPrintStr( vStr, Buffer );
        Vec_StrPrintStr( vStr, " " );
        Vec_StrPrintStr( vStr, SC_CellPinName(pRepr, pRepr->n_inputs) );
        Vec_StrPrintStr( vStr, "=" );
        Vec_StrPrintStr( vStr, SC_CellPinOutFunc(pRepr, 0) ? SC_CellPinOutFunc(pRepr, 0) : "?" );
        Vec_StrPrintStr( vStr, ";\n" );
        SC_CellForEachPinIn( pRepr, pPin, k )
        {
            float Delay = Abc_SclComputeDelayClassPin( p, pRepr, k, Slew, Gain );
            assert( Delay > 0 );
            Vec_StrPrintStr( vStr, "         PIN " );
            sprintf( Buffer, "%-4s", pPin->pName );
            Vec_StrPrintStr( vStr, Buffer );
            sprintf( Buffer, " UNKNOWN  1  999  %7.2f  0.00  %7.2f  0.00\n", Delay, Delay );
            Vec_StrPrintStr( vStr, Buffer );
        }
        Count++;
    }
    Vec_StrPrintStr( vStr, "\n.end\n" );
    Vec_StrPush( vStr, '\0' );
//    printf( "GENLIB library with %d gates is produced:\n", Count );
//    printf( "%s", Vec_StrArray(vStr) );
    if ( pnCellCount )
        *pnCellCount = Count;
    return vStr;
}